

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

int av1_get_rdmult_delta(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,int orig_rdmult)

{
  byte right_shift;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  TplDepFrame *pTVar6;
  long lVar7;
  int mi_col_00;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  undefined7 in_register_00000031;
  int iVar18;
  double beta;
  
  pAVar5 = cpi->ppi;
  right_shift = (pAVar5->tpl_data).tpl_stats_block_mis_log2;
  uVar14 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar14];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar14];
  pTVar6 = (pAVar5->tpl_data).tpl_frame;
  uVar14 = (ulong)((uint)cpi->gf_frame_index * 0x60);
  lVar7 = *(long *)((long)pTVar6->ref_map_index + (uVar14 - 0x18));
  iVar10 = *(int *)((long)pTVar6->ref_map_index + uVar14 + 0x20);
  iVar8 = av1_tpl_stats_ready(&pAVar5->tpl_data,(uint)cpi->gf_frame_index);
  if (((iVar8 != 0) && (bVar3 = (pAVar5->gf_group).update_type[cpi->gf_frame_index], bVar3 < 4)) &&
     (bVar3 != 1)) {
    bVar3 = (cpi->common).superres_scale_denominator;
    iVar13 = (uint)bVar3 * mi_col;
    iVar8 = iVar13 + 4;
    iVar13 = iVar13 + 0xb;
    if (-1 < iVar8) {
      iVar13 = iVar8;
    }
    iVar15 = ((uint)bVar1 + mi_col) * (uint)bVar3;
    iVar8 = iVar15 + 4;
    iVar15 = iVar15 + 0xb;
    if (-1 < iVar8) {
      iVar15 = iVar8;
    }
    iVar4 = (cpi->common).superres_upscaled_width;
    iVar18 = (uint)bVar3 << (right_shift & 0x1f);
    iVar8 = iVar18 + 4;
    iVar18 = iVar18 + 0xb;
    if (-1 < iVar8) {
      iVar18 = iVar8;
    }
    iVar8 = (uint)bVar2 + mi_row;
    lVar17 = 0;
    lVar12 = 0;
    mi_col_00 = iVar13 >> 3;
    do {
      for (; mi_col_00 < iVar15 >> 3; mi_col_00 = mi_col_00 + (iVar18 >> 3)) {
        if ((mi_row < (cpi->common).mi_params.mi_rows) &&
           (mi_col_00 < (int)(iVar4 + 7 >> 2 & 0xfffffffeU))) {
          iVar9 = av1_tpl_ptr_pos(mi_row,mi_col_00,iVar10,right_shift);
          lVar11 = (long)iVar9 * 200;
          lVar16 = *(long *)(lVar7 + 0x18 + lVar11) * 0x80;
          lVar17 = lVar17 + lVar16;
          lVar12 = *(long *)(lVar7 + 0x48 + lVar11) * 0x80 + lVar12 + lVar16 +
                   ((long)*(int *)((long)pTVar6->ref_map_index + uVar14 + 0x34) *
                    *(long *)(lVar7 + 0x40 + lVar11) + 0x100 >> 9);
        }
      }
      mi_row = mi_row + (1 << (right_shift & 0x1f));
      mi_col_00 = iVar13 >> 3;
    } while (mi_row < iVar8);
    beta = 1.0;
    if ((0 < lVar12) && (0 < lVar17)) {
      beta = (cpi->rd).r0 / ((double)lVar17 / (double)lVar12);
    }
    iVar10 = av1_get_adaptive_rdmult(cpi,beta);
    iVar8 = (orig_rdmult * 3) / 2;
    if (iVar8 <= iVar10) {
      iVar10 = iVar8;
    }
    iVar8 = orig_rdmult / 2;
    orig_rdmult = iVar10;
    if (iVar10 <= iVar8) {
      orig_rdmult = iVar8;
    }
    if (orig_rdmult < 2) {
      orig_rdmult = 1;
    }
  }
  return orig_rdmult;
}

Assistant:

int av1_get_rdmult_delta(AV1_COMP *cpi, BLOCK_SIZE bsize, int mi_row,
                         int mi_col, int orig_rdmult) {
  AV1_COMMON *const cm = &cpi->common;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  int64_t intra_cost = 0;
  int64_t mc_dep_cost = 0;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;

  if (!av1_tpl_stats_ready(&cpi->ppi->tpl_data, cpi->gf_frame_index)) {
    return orig_rdmult;
  }
  if (!is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) {
    return orig_rdmult;
  }

#ifndef NDEBUG
  int mi_count = 0;
#endif
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int step = 1 << block_mis_log2;
  const int row_step = step;
  const int col_step_sr =
      coded_to_superres_mi(step, cm->superres_scale_denominator);
  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) continue;
      TplDepStats *this_stats =
          &tpl_stats[av1_tpl_ptr_pos(row, col, tpl_stride, block_mis_log2)];
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      intra_cost += this_stats->recrf_dist << RDDIV_BITS;
      mc_dep_cost += (this_stats->recrf_dist << RDDIV_BITS) + mc_dep_delta;
#ifndef NDEBUG
      mi_count++;
#endif
    }
  }
  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);

  double beta = 1.0;
  if (mc_dep_cost > 0 && intra_cost > 0) {
    const double r0 = cpi->rd.r0;
    const double rk = (double)intra_cost / mc_dep_cost;
    beta = (r0 / rk);
  }

  int rdmult = av1_get_adaptive_rdmult(cpi, beta);

  rdmult = AOMMIN(rdmult, orig_rdmult * 3 / 2);
  rdmult = AOMMAX(rdmult, orig_rdmult * 1 / 2);

  rdmult = AOMMAX(1, rdmult);

  return rdmult;
}